

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O0

void jpc_mqdec_setctxs(jpc_mqdec_t *mqdec,int numctxs,jpc_mqctx_t *ctxs)

{
  int local_30;
  int local_2c;
  jpc_mqstate_t **ppjStack_28;
  int n;
  jpc_mqstate_t **ctx;
  jpc_mqctx_t *ctxs_local;
  int numctxs_local;
  jpc_mqdec_t *mqdec_local;
  
  ppjStack_28 = mqdec->ctxs;
  local_30 = numctxs;
  if (mqdec->maxctxs < numctxs) {
    local_30 = mqdec->maxctxs;
  }
  local_2c = local_30;
  ctx = (jpc_mqstate_t **)ctxs;
  while (local_2c = local_2c + -1, -1 < local_2c) {
    *ppjStack_28 = jpc_mqstates + (long)ctx[1] * 2 + (ulong)(*(byte *)ctx & 1);
    ppjStack_28 = ppjStack_28 + 1;
    ctx = ctx + 2;
  }
  local_2c = mqdec->maxctxs - numctxs;
  while (local_2c = local_2c + -1, -1 < local_2c) {
    *ppjStack_28 = jpc_mqstates;
    ppjStack_28 = ppjStack_28 + 1;
  }
  return;
}

Assistant:

void jpc_mqdec_setctxs(const jpc_mqdec_t *mqdec, int numctxs, const jpc_mqctx_t *ctxs)
{
	const jpc_mqstate_t **ctx;
	int n;

	ctx = mqdec->ctxs;
	n = JAS_MIN(mqdec->maxctxs, numctxs);
	while (--n >= 0) {
		*ctx = &jpc_mqstates[2 * ctxs->ind + ctxs->mps];
		++ctx;
		++ctxs;
	}
	n = mqdec->maxctxs - numctxs;
	while (--n >= 0) {
		*ctx = &jpc_mqstates[0];
		++ctx;
	}
}